

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-queue-foreach-delete.c
# Opt level: O3

int run_test_queue_foreach_delete(void)

{
  int iVar1;
  undefined8 uVar2;
  ulong *puVar3;
  uv_idle_t *puVar4;
  uv_prepare_t *puVar5;
  uv_check_t *puVar6;
  uv_fs_event_t *puVar7;
  long lVar8;
  int64_t eval_b;
  int64_t eval_a;
  uv_idle_t *puVar9;
  uv_idle_t uStack_200;
  void *pvStack_1a0;
  char *pcStack_190;
  code *pcStack_40;
  ulong local_38;
  ulong local_30;
  
  puVar4 = idle;
  lVar8 = 0;
  pcStack_40 = (code *)0x1b75b4;
  uVar2 = uv_default_loop();
  do {
    pcStack_40 = (code *)0x1b75c9;
    iVar1 = uv_idle_init(uVar2,puVar4);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
LAB_001b79ad:
      pcStack_40 = (code *)0x1b79ba;
      run_test_queue_foreach_delete_cold_1();
      goto LAB_001b79ba;
    }
    pcStack_40 = (code *)0x1b75f3;
    iVar1 = uv_idle_start(puVar4,*(undefined8 *)((long)idle_cbs + lVar8));
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
      pcStack_40 = (code *)0x1b79ad;
      run_test_queue_foreach_delete_cold_2();
      goto LAB_001b79ad;
    }
    lVar8 = lVar8 + 8;
    puVar4 = puVar4 + 1;
    local_30 = 0;
  } while (lVar8 != 0x18);
  puVar5 = prepare;
  lVar8 = 0;
  do {
    local_30 = 0;
    local_38 = 0;
    pcStack_40 = (code *)0x1b763b;
    iVar1 = uv_prepare_init(uVar2,puVar5);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b79c7;
    pcStack_40 = (code *)0x1b7665;
    iVar1 = uv_prepare_start(puVar5,*(undefined8 *)((long)prepare_cbs + lVar8));
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b79ba;
    lVar8 = lVar8 + 8;
    puVar5 = puVar5 + 1;
  } while (lVar8 != 0x18);
  puVar6 = check;
  lVar8 = 0;
  do {
    local_30 = 0;
    local_38 = 0;
    pcStack_40 = (code *)0x1b76ad;
    iVar1 = uv_check_init(uVar2,puVar6);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b79e1;
    pcStack_40 = (code *)0x1b76d7;
    iVar1 = uv_check_start(puVar6,*(undefined8 *)((long)check_cbs + lVar8));
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b79d4;
    lVar8 = lVar8 + 8;
    puVar6 = puVar6 + 1;
  } while (lVar8 != 0x18);
  puVar7 = fs_event;
  lVar8 = 0;
  do {
    local_30 = 0;
    local_38 = 0;
    pcStack_40 = (code *)0x1b7726;
    iVar1 = uv_fs_event_init(uVar2,puVar7);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b79fb;
    pcStack_40 = (code *)0x1b7755;
    iVar1 = uv_fs_event_start(puVar7,*(undefined8 *)((long)fs_event_cbs + lVar8),".",0);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b79ee;
    lVar8 = lVar8 + 8;
    puVar7 = puVar7 + 1;
  } while (lVar8 != 0x18);
  pcStack_40 = (code *)0x1b7790;
  iVar1 = uv_timer_init(uVar2,&timer);
  local_30 = (ulong)iVar1;
  local_38 = 0;
  if (local_30 != 0) goto LAB_001b7a08;
  pcStack_40 = (code *)0x1b77c5;
  iVar1 = uv_timer_start(&timer,helper_timer_cb,0,0);
  local_30 = (ulong)iVar1;
  local_38 = 0;
  if (local_30 != 0) goto LAB_001b7a15;
  pcStack_40 = (code *)0x1b77f0;
  iVar1 = uv_run(uVar2,2);
  local_30 = 1;
  local_38 = (ulong)iVar1;
  if (local_38 != 1) goto LAB_001b7a22;
  local_30 = 1;
  local_38 = (ulong)idle_cb_calls_0;
  if (local_38 != 1) goto LAB_001b7a2f;
  local_30 = 1;
  local_38 = (ulong)idle_cb_calls_2;
  if (local_38 != 1) goto LAB_001b7a49;
  local_30 = 1;
  local_38 = (ulong)prepare_cb_calls_0;
  if (local_38 != 1) goto LAB_001b7a56;
  local_30 = 1;
  local_38 = (ulong)prepare_cb_calls_2;
  if (local_38 != 1) goto LAB_001b7a70;
  local_30 = 1;
  local_38 = (ulong)check_cb_calls_0;
  if (local_38 != 1) goto LAB_001b7a7d;
  local_30 = 1;
  local_38 = (ulong)check_cb_calls_2;
  if (local_38 != 1) goto LAB_001b7a97;
  local_30 = 1;
  local_38 = (ulong)helper_timer_cb_calls;
  if (local_38 != 1) goto LAB_001b7aa4;
  pcStack_40 = (code *)0x1b795b;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_40 = (code *)0x1b7965;
  uv_run(uVar2,0);
  local_30 = 0;
  pcStack_40 = (code *)0x1b7976;
  iVar1 = uv_loop_close(uVar2);
  local_38 = (ulong)iVar1;
  if (local_30 == local_38) {
    pcStack_40 = (code *)0x1b7990;
    uv_library_shutdown();
    return 0;
  }
LAB_001b7ab1:
  puVar3 = &local_30;
  pcStack_40 = helper_timer_cb;
  run_test_queue_foreach_delete_cold_22();
  iVar1 = uv_fs_utime(0,0,puVar3[1],&uStack_200.loop,".",0);
  uStack_200.data = (void *)(long)iVar1;
  if (uStack_200.data == (void *)0x0) {
    uStack_200.data = pvStack_1a0;
    if (pvStack_1a0 != (void *)0x0) goto LAB_001b7b97;
    uStack_200.data = (void *)(long)(int)uStack_200.queue.prev;
    if (uStack_200.data == (void *)0xa) {
      iVar1 = strcmp(pcStack_190,".");
      uStack_200.data = (void *)(long)iVar1;
      if (uStack_200.data == (void *)0x0) {
        iVar1 = uv_fs_req_cleanup(&uStack_200.loop);
        helper_timer_cb_calls = helper_timer_cb_calls + 1;
        return iVar1;
      }
      goto LAB_001b7bb5;
    }
  }
  else {
    helper_timer_cb_cold_1();
LAB_001b7b97:
    helper_timer_cb_cold_2();
  }
  helper_timer_cb_cold_3();
LAB_001b7bb5:
  puVar4 = &uStack_200;
  helper_timer_cb_cold_4();
  if (puVar4 == idle) {
    idle_cb_calls_0 = idle_cb_calls_0 + 1;
    return 0x371b50;
  }
  puVar9 = idle;
  idle0_cb_cold_1();
  if (puVar4 != idle + 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0x7a,"handle","==","&(idle)[1]",puVar4,"==",0x371ba8,uVar2,puVar9);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
          ,0x7a,"0 && \"Shouldn\'t be called\" && (&idle[0])");
  abort();
LAB_001b79ba:
  pcStack_40 = (code *)0x1b79c7;
  run_test_queue_foreach_delete_cold_4();
LAB_001b79c7:
  pcStack_40 = (code *)0x1b79d4;
  run_test_queue_foreach_delete_cold_3();
LAB_001b79d4:
  pcStack_40 = (code *)0x1b79e1;
  run_test_queue_foreach_delete_cold_6();
LAB_001b79e1:
  pcStack_40 = (code *)0x1b79ee;
  run_test_queue_foreach_delete_cold_5();
LAB_001b79ee:
  pcStack_40 = (code *)0x1b79fb;
  run_test_queue_foreach_delete_cold_8();
LAB_001b79fb:
  pcStack_40 = (code *)0x1b7a08;
  run_test_queue_foreach_delete_cold_7();
LAB_001b7a08:
  pcStack_40 = (code *)0x1b7a15;
  run_test_queue_foreach_delete_cold_9();
LAB_001b7a15:
  pcStack_40 = (code *)0x1b7a22;
  run_test_queue_foreach_delete_cold_10();
LAB_001b7a22:
  pcStack_40 = (code *)0x1b7a2f;
  run_test_queue_foreach_delete_cold_11();
LAB_001b7a2f:
  pcStack_40 = (code *)0x1b7a3c;
  run_test_queue_foreach_delete_cold_12();
  pcStack_40 = (code *)0x1b7a49;
  run_test_queue_foreach_delete_cold_13();
LAB_001b7a49:
  pcStack_40 = (code *)0x1b7a56;
  run_test_queue_foreach_delete_cold_14();
LAB_001b7a56:
  pcStack_40 = (code *)0x1b7a63;
  run_test_queue_foreach_delete_cold_15();
  pcStack_40 = (code *)0x1b7a70;
  run_test_queue_foreach_delete_cold_16();
LAB_001b7a70:
  pcStack_40 = (code *)0x1b7a7d;
  run_test_queue_foreach_delete_cold_17();
LAB_001b7a7d:
  pcStack_40 = (code *)0x1b7a8a;
  run_test_queue_foreach_delete_cold_18();
  pcStack_40 = (code *)0x1b7a97;
  run_test_queue_foreach_delete_cold_19();
LAB_001b7a97:
  pcStack_40 = (code *)0x1b7aa4;
  run_test_queue_foreach_delete_cold_20();
LAB_001b7aa4:
  pcStack_40 = (code *)0x1b7ab1;
  run_test_queue_foreach_delete_cold_21();
  goto LAB_001b7ab1;
}

Assistant:

TEST_IMPL(queue_foreach_delete) {
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  INIT_AND_START(idle,    loop);
  INIT_AND_START(prepare, loop);
  INIT_AND_START(check,   loop);

#ifdef __linux__
  init_and_start_fs_events(loop);

  /* helper timer to trigger async and fs_event callbacks */
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, helper_timer_cb, 0, 0);
  ASSERT_OK(r);
#endif

  r = uv_run(loop, UV_RUN_NOWAIT);
  ASSERT_EQ(1, r);

  END_ASSERTS(idle);
  END_ASSERTS(prepare);
  END_ASSERTS(check);

#ifdef __linux__
  ASSERT_EQ(1, helper_timer_cb_calls);
#endif

  MAKE_VALGRIND_HAPPY(loop);

  return 0;
}